

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTaskExecutor.h
# Opt level: O2

void HighsTaskExecutor::run_worker(int workerId,HighsTaskExecutor *ptr)

{
  __uniq_ptr_impl<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_> localDeque;
  ExecutorHandle *this;
  tuple<HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_> *ptVar1;
  HighsTask *task;
  
  this = (ExecutorHandle *)globalExecutorHandle();
  this->ptr = ptr;
  if (((ptr->hasStopped)._M_base._M_i & 1U) == 0) {
    localDeque._M_t.
    super__Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_>.
    super__Head_base<0UL,_HighsSplitDeque_*,_false>._M_head_impl =
         (ptr->workerDeques).
         super__Vector_base<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[workerId]._M_t.
         super___uniq_ptr_impl<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>.
         _M_t;
    ptVar1 = (tuple<HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_> *)
             threadLocalWorkerDequePtr();
    ptVar1->
    super__Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_> =
         (_Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_>)
         localDeque._M_t.
         super__Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_>.
         super__Head_base<0UL,_HighsSplitDeque_*,_false>._M_head_impl;
    do {
      task = HighsSplitDeque::WorkerBunk::waitForNewTask
                       ((ptr->workerBunk).
                        super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(HighsSplitDeque *)
                               localDeque._M_t.
                               super__Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
                               .super__Head_base<0UL,_HighsSplitDeque_*,_false>._M_head_impl);
      do {
        if (task == (HighsTask *)0x0) goto LAB_002473da;
        HighsSplitDeque::runStolenTask
                  ((HighsSplitDeque *)
                   localDeque._M_t.
                   super__Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
                   .super__Head_base<0UL,_HighsSplitDeque_*,_false>._M_head_impl,task);
        task = random_steal_loop(ptr,(HighsSplitDeque *)
                                     localDeque._M_t.
                                     super__Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
                                     .super__Head_base<0UL,_HighsSplitDeque_*,_false>._M_head_impl);
      } while (task != (HighsTask *)0x0);
    } while( true );
  }
LAB_002473da:
  ExecutorHandle::dispose(this);
  return;
}

Assistant:

static void run_worker(int workerId, HighsTaskExecutor* ptr) {
    auto& executorHandle = threadLocalExecutorHandle();
    executorHandle.ptr = ptr;

    if (!ptr->hasStopped) {
      HighsSplitDeque* localDeque = ptr->workerDeques[workerId].get();
      threadLocalWorkerDeque() = localDeque;

      HighsTask* currentTask = ptr->workerBunk->waitForNewTask(localDeque);
      while (currentTask != nullptr) {
        localDeque->runStolenTask(currentTask);

        currentTask = ptr->random_steal_loop(localDeque);
        if (currentTask != nullptr) continue;

        currentTask = ptr->workerBunk->waitForNewTask(localDeque);
      }
    }

    executorHandle.dispose();
  }